

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O0

void __thiscall Fluid::draw_debug_lines(Fluid *this,mat4 *projection,mat4 *view)

{
  PFNGLDRAWARRAYSPROC p_Var1;
  PFNGLUNIFORMMATRIX4FVPROC p_Var2;
  GLint GVar3;
  int iVar4;
  float *pfVar5;
  socklen_t __len;
  sockaddr *__addr;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  mat4 *local_20;
  mat4 *view_local;
  mat4 *projection_local;
  Fluid *this_local;
  
  local_20 = view;
  view_local = projection;
  projection_local = (mat4 *)this;
  gfx::Program::use(&this->debug_lines_program);
  p_Var2 = glad_glUniformMatrix4fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"projection",&local_41);
  GVar3 = gfx::Program::uniform_loc(&this->debug_lines_program,&local_40);
  pfVar5 = glm::value_ptr<float,(glm::qualifier)0>(view_local);
  (*p_Var2)(GVar3,1,'\0',pfVar5);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  p_Var2 = glad_glUniformMatrix4fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"view",&local_79);
  GVar3 = gfx::Program::uniform_loc(&this->debug_lines_program,&local_78);
  pfVar5 = glm::value_ptr<float,(glm::qualifier)0>(local_20);
  iVar4 = 1;
  (*p_Var2)(GVar3,1,'\0',pfVar5);
  __len = (socklen_t)pfVar5;
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  gfx::VAO::bind(&this->debug_lines_vao,iVar4,__addr,__len);
  (*glad_glLineWidth)(4.0);
  p_Var1 = glad_glDrawArrays;
  iVar4 = gfx::Buffer::length(&this->debug_lines_ssbo);
  (*p_Var1)(0,0,iVar4);
  gfx::VAO::unbind(&this->debug_lines_vao);
  gfx::Program::disuse(&this->debug_lines_program);
  return;
}

Assistant:

void draw_debug_lines(const glm::mat4& projection, const glm::mat4& view) {
        debug_lines_program.use();
        glUniformMatrix4fv(debug_lines_program.uniform_loc("projection"), 1, GL_FALSE, glm::value_ptr(projection));
        glUniformMatrix4fv(debug_lines_program.uniform_loc("view"), 1, GL_FALSE, glm::value_ptr(view));
        debug_lines_vao.bind();
        glLineWidth(4.0);
        glDrawArrays(GL_POINTS, 0, debug_lines_ssbo.length());
        debug_lines_vao.unbind();
        debug_lines_program.disuse();
    }